

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::boxMesh(Mesh *__return_storage_ptr__,float _width,float _height,float _depth,int _resX,
                    int _resY,int _resZ)

{
  float fVar1;
  int iVar2;
  uint32_t uVar3;
  float fVar4;
  int ix;
  int iVar5;
  uint32_t _i;
  uint uVar6;
  int iVar7;
  int iy;
  int iVar8;
  int iVar9;
  int ix_1;
  uint32_t _i_00;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar19;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar20;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar21;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar22;
  vec2 texcoord;
  vec3 vert;
  ulong local_118;
  ulong local_f0;
  ulong local_e8;
  vec3 local_c8;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  local_98 = _width;
  uStack_94 = in_XMM0_Db;
  uStack_90 = in_XMM0_Dc;
  uStack_8c = in_XMM0_Dd;
  local_88 = _depth;
  uStack_84 = in_XMM2_Db;
  uStack_80 = in_XMM2_Dc;
  uStack_7c = in_XMM2_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  iVar8 = _resX + 1;
  fVar4 = 0.0;
  if (_resX < 1) {
    iVar8 = 0;
  }
  fVar18 = (float)(_resY + 1);
  if (_resY < 1) {
    fVar18 = 0.0;
  }
  iVar11 = _resZ + 1;
  if (_resZ < 1) {
    iVar11 = 0;
  }
  __return_storage_ptr__->m_drawMode = TRIANGLES;
  aVar22.x = local_98 * 0.5;
  local_78 = ZEXT416((uint)(local_88 * 0.5));
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2.z = 1.0;
  fVar16 = (float)iVar8 + -1.0;
  fVar17 = (float)(int)fVar18 + -1.0;
  local_68.x = -aVar22.x;
  uStack_64 = uStack_94 ^ 0x80000000;
  uStack_60 = uStack_90 ^ 0x80000000;
  uStack_5c = uStack_8c ^ 0x80000000;
  iVar12 = 0;
  if (0 < iVar8) {
    iVar12 = iVar8;
  }
  fVar1 = 0.0;
  if (0 < (int)fVar18) {
    fVar1 = fVar18;
  }
  local_48 = ZEXT416((uint)(_height * 0.5));
  local_a8 = -(_height * 0.5);
  uStack_a4 = 0x80000000;
  uStack_a0 = 0x80000000;
  uStack_9c = 0x80000000;
  for (; fVar4 != fVar1; fVar4 = (float)((int)fVar4 + 1)) {
    aVar20.y = 1.0 - (float)(int)fVar4 / fVar17;
    aVar21.y = local_a8 - (aVar20.y + -1.0) * _height;
    for (iVar5 = 0; iVar12 != iVar5; iVar5 = iVar5 + 1) {
      texcoord.field_0.x = (float)iVar5 / fVar16;
      vert.field_0.x = texcoord.field_0.x * local_98 + local_68.x;
      vert.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_78._0_4_;
      texcoord.field_1.y = aVar20.y;
      vert.field_1.y = aVar21.y;
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addTexCoord(__return_storage_ptr__,&texcoord);
      Mesh::addNormal(__return_storage_ptr__,&local_c8);
    }
  }
  uVar3 = 1;
  iVar5 = 1;
  if (1 < iVar8) {
    iVar5 = iVar8;
  }
  iVar5 = iVar5 + -1;
  if ((int)fVar18 < 2) {
    fVar18 = 1.4013e-45;
  }
  iVar2 = (int)fVar18 + -1;
  iVar7 = 0;
  while (iVar7 != iVar2) {
    iVar7 = iVar7 + 1;
    iVar13 = iVar5;
    _i_00 = uVar3;
    while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
      Mesh::addIndex(__return_storage_ptr__,_i_00 - 1);
      Mesh::addIndex(__return_storage_ptr__,_i_00);
      _i = (_i_00 + iVar8) - 1;
      Mesh::addIndex(__return_storage_ptr__,_i);
      Mesh::addIndex(__return_storage_ptr__,_i_00);
      Mesh::addIndex(__return_storage_ptr__,_i_00 + iVar8);
      Mesh::addIndex(__return_storage_ptr__,_i);
      _i_00 = _i_00 + 1;
    }
    uVar3 = uVar3 + iVar8;
  }
  local_118 = ((long)(__return_storage_ptr__->m_vertices).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2.z = 0.0;
  fVar18 = (float)iVar11 + -1.0;
  fVar4 = 0.0;
  iVar7 = 0;
  if (0 < iVar11) {
    iVar7 = iVar11;
  }
  local_58 = -local_88;
  uStack_54 = uStack_84 ^ 0x80000000;
  uStack_50 = uStack_80 ^ 0x80000000;
  uStack_4c = uStack_7c ^ 0x80000000;
  while (fVar4 != fVar1) {
    aVar20.y = 1.0 - (float)(int)fVar4 / fVar17;
    aVar21.y = local_a8 - (aVar20.y + -1.0) * _height;
    local_b8 = fVar4;
    for (iVar13 = 0; iVar7 != iVar13; iVar13 = iVar13 + 1) {
      texcoord.field_0.x = (float)iVar13 / fVar18;
      vert.field_2.z = texcoord.field_0.x * local_58 + (float)local_78._0_4_;
      texcoord.field_1.y = aVar20.y;
      vert.field_0.x = aVar22.x;
      vert.field_1.y = aVar21.y;
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addTexCoord(__return_storage_ptr__,&texcoord);
      Mesh::addNormal(__return_storage_ptr__,&local_c8);
    }
    fVar4 = (float)((int)local_b8 + 1);
  }
  iVar13 = 1;
  if (1 < iVar11) {
    iVar13 = iVar11;
  }
  iVar13 = iVar13 + -1;
  iVar9 = 0;
  while (iVar9 != iVar2) {
    iVar9 = iVar9 + 1;
    uVar14 = local_118;
    iVar10 = iVar13;
    while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
      uVar3 = (uint32_t)uVar14;
      Mesh::addIndex(__return_storage_ptr__,uVar3);
      uVar6 = uVar3 + 1;
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar11 + uVar3);
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar11 + uVar3 + 1);
      Mesh::addIndex(__return_storage_ptr__,iVar11 + uVar3);
      uVar14 = (ulong)uVar6;
    }
    local_118 = (ulong)(uint)((int)local_118 + iVar11);
  }
  local_f0 = ((long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2.z = 0.0;
  aVar19.z = -(float)local_78._0_4_;
  for (fVar4 = 0.0; fVar4 != fVar1; fVar4 = (float)((int)fVar4 + 1)) {
    aVar20.y = 1.0 - (float)(int)fVar4 / fVar17;
    local_b8 = local_a8 - (aVar20.y + -1.0) * _height;
    for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
      texcoord.field_0.x = (float)iVar9 / fVar18;
      vert.field_0 = local_68;
      vert.field_1.y = local_b8;
      vert.field_2.z = texcoord.field_0.x * local_88 + aVar19.z;
      texcoord.field_1.y = aVar20.y;
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addTexCoord(__return_storage_ptr__,&texcoord);
      Mesh::addNormal(__return_storage_ptr__,&local_c8);
    }
  }
  iVar9 = 0;
  while (iVar9 != iVar2) {
    iVar9 = iVar9 + 1;
    uVar14 = local_f0;
    iVar10 = iVar13;
    while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
      uVar3 = (uint32_t)uVar14;
      Mesh::addIndex(__return_storage_ptr__,uVar3);
      uVar6 = uVar3 + 1;
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar11 + uVar3);
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar11 + uVar3 + 1);
      Mesh::addIndex(__return_storage_ptr__,iVar11 + uVar3);
      uVar14 = (ulong)uVar6;
    }
    local_f0 = (ulong)(uint)((int)local_f0 + iVar11);
  }
  local_f0 = ((long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2.z = -1.0;
  local_b8 = -local_98;
  uStack_b4 = uStack_94 ^ 0x80000000;
  uStack_b0 = uStack_90 ^ 0x80000000;
  uStack_ac = uStack_8c ^ 0x80000000;
  for (fVar4 = 0.0; fVar4 != fVar1; fVar4 = (float)((int)fVar4 + 1)) {
    aVar20.y = 1.0 - (float)(int)fVar4 / fVar17;
    aVar21.y = local_a8 - (aVar20.y + -1.0) * _height;
    for (iVar11 = 0; iVar12 != iVar11; iVar11 = iVar11 + 1) {
      texcoord.field_0.x = (float)iVar11 / fVar16;
      vert.field_0.x = texcoord.field_0.x * local_b8 + aVar22.x;
      texcoord.field_1.y = aVar20.y;
      vert.field_1.y = aVar21.y;
      vert.field_2.z = aVar19.z;
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addTexCoord(__return_storage_ptr__,&texcoord);
      Mesh::addNormal(__return_storage_ptr__,&local_c8);
    }
  }
  iVar11 = 0;
  while (iVar11 != iVar2) {
    iVar11 = iVar11 + 1;
    uVar14 = local_f0;
    iVar9 = iVar5;
    while (bVar15 = iVar9 != 0, iVar9 = iVar9 + -1, bVar15) {
      uVar3 = (uint32_t)uVar14;
      Mesh::addIndex(__return_storage_ptr__,uVar3);
      uVar6 = uVar3 + 1;
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3);
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3 + 1);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3);
      uVar14 = (ulong)uVar6;
    }
    local_f0 = (ulong)(uint)((int)local_f0 + iVar8);
  }
  local_118 = ((long)(__return_storage_ptr__->m_vertices).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
  local_c8.field_2.z = 0.0;
  for (iVar11 = 0; iVar11 != iVar7; iVar11 = iVar11 + 1) {
    aVar20.y = 1.0 - (float)iVar11 / fVar18;
    fVar4 = aVar20.y * local_88;
    for (iVar2 = 0; iVar12 != iVar2; iVar2 = iVar2 + 1) {
      texcoord.field_0.x = (float)iVar2 / fVar16;
      vert.field_0.x = texcoord.field_0.x * local_98 + local_68.x;
      vert.field_1.y = local_a8;
      texcoord.field_1.y = aVar20.y;
      vert.field_2.z = fVar4 + aVar19.z;
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addTexCoord(__return_storage_ptr__,&texcoord);
      Mesh::addNormal(__return_storage_ptr__,&local_c8);
    }
  }
  iVar11 = 0;
  while (iVar11 != iVar13) {
    iVar11 = iVar11 + 1;
    uVar14 = local_118;
    iVar2 = iVar5;
    while (bVar15 = iVar2 != 0, iVar2 = iVar2 + -1, bVar15) {
      uVar3 = (uint32_t)uVar14;
      Mesh::addIndex(__return_storage_ptr__,uVar3);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3);
      uVar6 = uVar3 + 1;
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3 + 1);
      uVar14 = (ulong)uVar6;
    }
    local_118 = (ulong)(uint)((int)local_118 + iVar8);
  }
  local_e8 = ((long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_c8.field_2.z = 0.0;
  for (iVar11 = 0; iVar11 != iVar7; iVar11 = iVar11 + 1) {
    aVar20.y = 1.0 - (float)iVar11 / fVar18;
    aVar19.z = aVar20.y * local_58 + (float)local_78._0_4_;
    for (iVar2 = 0; iVar12 != iVar2; iVar2 = iVar2 + 1) {
      texcoord.field_0.x = (float)iVar2 / fVar16;
      vert.field_0.x = texcoord.field_0.x * local_98 + local_68.x;
      vert.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_48._0_4_;
      texcoord.field_1.y = aVar20.y;
      vert.field_2.z = aVar19.z;
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addTexCoord(__return_storage_ptr__,&texcoord);
      Mesh::addNormal(__return_storage_ptr__,&local_c8);
    }
  }
  iVar11 = 0;
  while (iVar11 != iVar13) {
    iVar11 = iVar11 + 1;
    uVar14 = local_e8;
    iVar12 = iVar5;
    while (bVar15 = iVar12 != 0, iVar12 = iVar12 + -1, bVar15) {
      uVar3 = (uint32_t)uVar14;
      Mesh::addIndex(__return_storage_ptr__,uVar3);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3);
      uVar6 = uVar3 + 1;
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,uVar6);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3);
      Mesh::addIndex(__return_storage_ptr__,iVar8 + uVar3 + 1);
      uVar14 = (ulong)uVar6;
    }
    local_e8 = (ulong)(uint)((int)local_e8 + iVar8);
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh boxMesh( float _width, float _height, float _depth, int _resX, int _resY, int _resZ ) {

    // mesh only available as triangles //
    Mesh mesh;
    mesh.setDrawMode( TRIANGLES );

    _resX = _resX + 1;
    _resY = _resY + 1;
    _resZ = _resZ + 1;

    if ( _resX < 2 ) _resX = 0;
    if ( _resY < 2 ) _resY = 0;
    if ( _resZ < 2 ) _resZ = 0;

    // halves //
    float halfW = _width * .5f;
    float halfH = _height * .5f;
    float halfD = _depth * .5f;

    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 texcoord;
    std::size_t vertOffset = 0;

    // TRIANGLES //

    // Front Face //
    normal = {0.f, 0.f, 1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Right Side Face //
    normal = {1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Left Side Face //
    normal = {-1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = -halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Back Face //
    normal = {0.f, 0.f, -1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * -_width + halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = -halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();


    // Top Face //
    normal = {0.f, -1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = -halfH;
            vert.z = texcoord.y * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Bottom Face //
    normal = {0.f, 1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = halfH;
            vert.z = texcoord.y * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }
    mesh.computeTangents();

    return mesh;
}